

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

string * __thiscall fasttext::Args::getAutotuneMetricLabel_abi_cxx11_(Args *this)

{
  metric_name mVar1;
  ulong uVar2;
  runtime_error *this_00;
  long in_RSI;
  string *in_RDI;
  Args *in_stack_00000008;
  string *label;
  string local_38 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar3;
  
  mVar1 = getAutotuneMetric(in_stack_00000008);
  if (mVar1 == labelf1score) {
    uVar3 = 0;
    std::__cxx11::string::substr((ulong)in_RDI,in_RSI + 0x158);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((char *)CONCAT17(uVar3,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0);
      std::runtime_error::runtime_error(this_00,local_38);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    std::__cxx11::string::string(in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string Args::getAutotuneMetricLabel() const {
  if (getAutotuneMetric() == metric_name::labelf1score) {
    std::string label = autotuneMetric.substr(3);
    if (label.empty()) {
      throw std::runtime_error("Empty metric label : " + autotuneMetric);
    }
    return label;
  }
  return std::string();
}